

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlOutputBufferPtr xmlAllocOutputBufferInternal(xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr output;
  xmlBufPtr pxVar1;
  
  output = (xmlOutputBufferPtr)(*xmlMalloc)(0x38);
  if (output == (xmlOutputBufferPtr)0x0) {
    xmlIOErrMemory("creating output buffer");
  }
  else {
    output->buffer = (xmlBufPtr)0x0;
    output->conv = (xmlBufPtr)0x0;
    output->closecallback = (xmlOutputCloseCallback)0x0;
    output->encoder = (xmlCharEncodingHandlerPtr)0x0;
    output->context = (void *)0x0;
    output->writecallback = (xmlOutputWriteCallback)0x0;
    output->written = 0;
    output->error = 0;
    pxVar1 = xmlBufCreate();
    output->buffer = pxVar1;
    if (pxVar1 != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(pxVar1,XML_BUFFER_ALLOC_IO);
      output->encoder = encoder;
      if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
        output->conv = (xmlBufPtr)0x0;
LAB_0019744f:
        output->written = 0;
        output->context = (void *)0x0;
        output->writecallback = (xmlOutputWriteCallback)0x0;
        output->closecallback = (xmlOutputCloseCallback)0x0;
        return output;
      }
      pxVar1 = xmlBufCreateSize(4000);
      output->conv = pxVar1;
      if (pxVar1 != (xmlBufPtr)0x0) {
        xmlCharEncOutput(output,1);
        goto LAB_0019744f;
      }
      xmlBufFree(output->buffer);
    }
    (*xmlFree)(output);
  }
  return (xmlOutputBufferPtr)0x0;
}

Assistant:

xmlOutputBufferPtr
xmlAllocOutputBufferInternal(xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    ret = (xmlOutputBufferPtr) xmlMalloc(sizeof(xmlOutputBuffer));
    if (ret == NULL) {
	xmlIOErrMemory("creating output buffer");
	return(NULL);
    }
    memset(ret, 0, (size_t) sizeof(xmlOutputBuffer));
    ret->buffer = xmlBufCreate();
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }


    /*
     * For conversion buffers we use the special IO handling
     */
    xmlBufSetAllocationScheme(ret->buffer, XML_BUFFER_ALLOC_IO);

    ret->encoder = encoder;
    if (encoder != NULL) {
        ret->conv = xmlBufCreateSize(4000);
	if (ret->conv == NULL) {
            xmlBufFree(ret->buffer);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * This call is designed to initiate the encoder state
	 */
        xmlCharEncOutput(ret, 1);
    } else
        ret->conv = NULL;
    ret->writecallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->written = 0;

    return(ret);
}